

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddWindow.c
# Opt level: O2

int ddWindowConv2(DdManager *table,int low,int high)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  void *__ptr;
  ulong uVar5;
  uint uVar6;
  int y;
  int x;
  ulong uVar7;
  
  uVar6 = high - low;
  if (uVar6 == 0 || high < low) {
    do {
    } while( true );
  }
  uVar7 = (ulong)uVar6;
  __ptr = malloc(uVar7 * 4);
  if (__ptr == (void *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
LAB_00751e12:
    iVar3 = 0;
  }
  else {
    for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      *(undefined4 *)((long)__ptr + uVar5 * 4) = 1;
    }
    iVar3 = table->keys - table->isolated;
    uVar5 = 0;
    bVar2 = false;
    do {
      for (; bVar1 = bVar2, uVar5 != uVar7; uVar5 = uVar5 + 1) {
        if (*(int *)((long)__ptr + uVar5 * 4) != 0) {
          y = (int)uVar5 + low + 1;
          x = low + (int)uVar5;
          iVar4 = cuddSwapInPlace(table,x,y);
          if ((iVar4 == 0) || ((iVar3 <= iVar4 && (iVar4 = cuddSwapInPlace(table,x,y), iVar4 == 0)))
             ) {
            free(__ptr);
            goto LAB_00751e12;
          }
          if (iVar4 < iVar3) {
            if ((long)uVar5 < (long)(int)(uVar6 - 1)) {
              *(undefined4 *)((long)__ptr + uVar5 * 4 + 4) = 1;
            }
            bVar1 = true;
            if (uVar5 != 0) {
              *(undefined4 *)((long)__ptr + uVar5 * 4 + -4) = 1;
            }
          }
          *(undefined4 *)((long)__ptr + uVar5 * 4) = 0;
          iVar3 = iVar4;
        }
        bVar2 = bVar1;
      }
      uVar5 = 0;
      bVar2 = false;
    } while (bVar1);
    free(__ptr);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int
ddWindowConv2(
  DdManager * table,
  int  low,
  int  high)
{
    int x;
    int res;
    int nwin;
    int newevent;
    int *events;
    int size;

#ifdef DD_DEBUG
    assert(low >= 0 && high < table->size);
#endif

    if (high-low < 1) return(ddWindowConv2(table,low,high));

    nwin = high-low;
    events = ABC_ALLOC(int,nwin);
    if (events == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (x=0; x<nwin; x++) {
        events[x] = 1;
    }

    res = table->keys - table->isolated;
    do {
        newevent = 0;
        for (x=0; x<nwin; x++) {
            if (events[x]) {
                size = res;
                res = cuddSwapInPlace(table,x+low,x+low+1);
                if (res == 0) {
                    ABC_FREE(events);
                    return(0);
                }
                if (res >= size) { /* no improvement: undo permutation */
                    res = cuddSwapInPlace(table,x+low,x+low+1);
                    if (res == 0) {
                        ABC_FREE(events);
                        return(0);
                    }
                }
                if (res < size) {
                    if (x < nwin-1)     events[x+1] = 1;
                    if (x > 0)          events[x-1] = 1;
                    newevent = 1;
                }
                events[x] = 0;
#ifdef DD_STATS
                if (res < size) {
                    (void) fprintf(table->out,"-");
                } else {
                    (void) fprintf(table->out,"=");
                }
                fflush(table->out);
#endif
            }
        }
#ifdef DD_STATS
        if (newevent) {
            (void) fprintf(table->out,"|");
            fflush(table->out);
        }
#endif
    } while (newevent);

    ABC_FREE(events);

    return(1);

}